

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O2

int VerifyRSA::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  long lVar2;
  RSA *rsa;
  undefined7 extraout_var;
  int iVar3;
  ulong uVar4;
  bool authentic;
  size_t encMessageLength;
  uchar *encMessage;
  bool local_39;
  size_t local_38;
  uchar *local_30;
  
  iVar3 = 0;
  lVar2 = std::__cxx11::string::find((char *)ctx,0x103020);
  if (lVar2 == 0) {
    if (*(long *)(sig + 8) == 0) {
      iVar3 = 0;
    }
    else {
      rsa = createPublicRSA((string *)ctx);
      Base64Decode((char *)siglen,&local_30,&local_38);
      bVar1 = RSAVerifySignature(rsa,local_30,local_38,*(char **)sig,*(size_t *)(sig + 8),&local_39)
      ;
      uVar4 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
      free(local_30);
      iVar3 = (int)CONCAT71((int7)(uVar4 >> 8),(byte)uVar4 & local_39);
    }
  }
  return iVar3;
}

Assistant:

bool VerifyRSA::verify(std::string publicKey, std::string plainText, char *signatureBase64)
{
    if (publicKey.find("-----BEGIN RSA PUBLIC KEY-----",0)!=0 ||
        plainText.empty())
    {
        return false;
    }
    if (sizeof(signatureBase64)<1) {
        std::cerr << "Not a valid signature!" << std::endl;
        return false;
    }
    RSA* publicRSA = createPublicRSA(publicKey);
    unsigned char* encMessage;
    size_t encMessageLength;
    bool authentic;
    Base64Decode(signatureBase64, &encMessage, &encMessageLength);
    bool result = RSAVerifySignature(publicRSA, encMessage, encMessageLength, plainText.c_str(), plainText.length(), &authentic);
    free(encMessage);
    return result & authentic;
}